

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::GetSetterFromDescriptor<false>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          DictionaryPropertyDescriptor<unsigned_short> *descriptor,Var *setterValue,
          PropertyValueInfo *info)

{
  unsigned_short uVar1;
  Var pvVar2;
  PropertyValueInfo *info_local;
  Var *setterValue_local;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  if ((descriptor->Attributes & 8) == 0) {
    uVar1 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(descriptor);
    if (uVar1 == 0xffff) {
      uVar1 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(descriptor);
      if (uVar1 == 0xffff) {
        this_local._4_4_ = None;
      }
      else {
        uVar1 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(descriptor);
        pvVar2 = DynamicObject::GetSlot(instance,(uint)uVar1);
        *setterValue = pvVar2;
        uVar1 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(descriptor);
        SetPropertyValueInfoNonFixed
                  (this,info,&instance->super_RecyclableObject,uVar1,descriptor->Attributes,
                   InlineCacheSetterFlag);
        this_local._4_4_ = Accessor;
      }
    }
    else if ((descriptor->Attributes & 4) == 0) {
      if ((descriptor->Attributes & 0x80) == 0) {
        this_local._4_4_ = Data;
      }
      else {
        this_local._4_4_ = Const|Data;
      }
    }
    else {
      this_local._4_4_ = WritableData;
    }
  }
  else {
    this_local._4_4_ = None;
  }
  return this_local._4_4_;
}

Assistant:

DescriptorFlags DictionaryTypeHandlerBase<T>::GetSetterFromDescriptor(DynamicObject* instance, DictionaryPropertyDescriptor<T> * descriptor, Var* setterValue, PropertyValueInfo* info)
    {
        if (descriptor->Attributes & PropertyDeleted)
        {
            return None;
        }
        if (descriptor->template GetDataPropertyIndex<allowLetConstGlobal>() != NoSlots)
        {
            // not a setter but shadows
            if (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
            {
                return (descriptor->Attributes & PropertyConst) ? (DescriptorFlags)(Const | Data) : WritableData;
            }
            if (descriptor->Attributes & PropertyWritable)
            {
                return WritableData;
            }
            if (descriptor->Attributes & PropertyConst)
            {
                return (DescriptorFlags)(Const | Data);
            }
            return Data;
        }
        else if (descriptor->GetSetterPropertyIndex() != NoSlots)
        {
            *setterValue = ((DynamicObject*)instance)->GetSlot(descriptor->GetSetterPropertyIndex());
            SetPropertyValueInfoNonFixed(info, instance, descriptor->GetSetterPropertyIndex(), descriptor->Attributes, InlineCacheSetterFlag);
            return Accessor;
        }
        return None;
    }